

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

int emitJump(uint8_t instruction)

{
  Chunk *pCVar1;
  
  emitByte('\0');
  emitByte('\0');
  emitByte('\0');
  pCVar1 = currentChunk();
  return pCVar1->count + -2;
}

Assistant:

static int emitJump(uint8_t instruction) {
    emitByte(instruction);
    emitByte(0xff);
    emitByte(0xff);
    return currentChunk()->count - 2;
}